

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O1

void GetResidual(int width,int height,uint32_t *upper_row,uint32_t *current_row,uint8_t *max_diffs,
                int mode,int x_start,int x_end,int y,int max_quantization,int exact,
                int used_subtract_green,uint32_t *out)

{
  VP8LPredictorFunc p_Var1;
  uint uVar2;
  uint8_t uVar3;
  uint32_t uVar4;
  VP8LPredictorAddSubFunc UNRECOVERED_JUMPTABLE;
  byte bVar5;
  char cVar6;
  byte bVar7;
  uint quantization;
  long lVar8;
  int iVar9;
  uint8_t uVar10;
  byte bVar11;
  uint32_t *puVar12;
  VP8LPredictorAddSubFunc *pp_Var13;
  uint uVar14;
  uint local_8c;
  
  if (exact != 0) {
    iVar9 = x_end - x_start;
    if (x_start == 0) {
      pp_Var13 = VP8LPredictorsSub + 2;
      puVar12 = upper_row;
      if (y == 0) {
        pp_Var13 = VP8LPredictorsSub;
        puVar12 = (uint32_t *)0x0;
      }
      x_start = 1;
      (**pp_Var13)(current_row,puVar12,1,out);
      out = out + 1;
      iVar9 = iVar9 + -1;
    }
    if (y == 0) {
      puVar12 = (uint32_t *)0x0;
      UNRECOVERED_JUMPTABLE = VP8LPredictorsSub[1];
    }
    else {
      puVar12 = upper_row + x_start;
      UNRECOVERED_JUMPTABLE = VP8LPredictorsSub[mode];
    }
    (*UNRECOVERED_JUMPTABLE)(current_row + x_start,puVar12,iVar9,out);
    return;
  }
  if (x_start < x_end) {
    p_Var1 = VP8LPredictors[mode];
    lVar8 = (long)x_start;
    do {
      if (y == 0) {
        if (lVar8 == 0) {
          uVar4 = 0xff000000;
        }
        else {
          uVar4 = current_row[lVar8 + -1];
        }
      }
      else if (lVar8 == 0) {
        uVar4 = *upper_row;
      }
      else {
        uVar4 = (*p_Var1)(current_row + lVar8 + -1,upper_row + lVar8);
      }
      if (((((mode == 0 || max_quantization == 1) || y == 0) || (height + -1 == y)) || (lVar8 == 0))
         || (lVar8 == width + -1)) {
        uVar14 = (current_row[lVar8] | 0xff00) - (uVar4 & 0xff00ff) & 0xff00ff |
                 (current_row[lVar8] | 0xff0000) - (uVar4 & 0xff00ff00) & 0xff00ff00;
      }
      else {
        uVar14 = current_row[lVar8];
        uVar2 = max_quantization;
        if (max_diffs[lVar8] < 3) {
          uVar14 = (uVar14 | 0xff00) - (uVar4 & 0xff00ff) & 0xff00ff |
                   (uVar14 | 0xff0000) - (uVar4 & 0xff00ff00) & 0xff00ff00;
        }
        else {
          do {
            quantization = uVar2;
            uVar2 = quantization >> 1;
          } while ((int)(uint)max_diffs[lVar8] <= (int)quantization);
          uVar10 = (uint8_t)(uVar14 >> 0x18);
          uVar3 = (uint8_t)(uVar4 >> 0x18);
          if (uVar14 < 0x1000000 || uVar14 >> 0x18 == 0xff) {
            bVar11 = uVar10 - uVar3;
          }
          else {
            bVar11 = NearLosslessComponent(uVar10,uVar3,0xff,quantization);
          }
          local_8c = (uint)bVar11;
          uVar10 = (uint8_t)(uVar14 >> 8);
          uVar3 = (uint8_t)(uVar4 >> 8);
          bVar11 = NearLosslessComponent(uVar10,uVar3,0xff,quantization);
          bVar5 = bVar11 + uVar3;
          cVar6 = bVar5 - uVar10;
          if (used_subtract_green == 0) {
            cVar6 = '\0';
          }
          bVar7 = -(used_subtract_green == 0) | ~bVar5;
          bVar5 = NearLosslessComponent
                            ((char)(uVar14 >> 0x10) - cVar6,(uint8_t)(uVar4 >> 0x10),bVar7,
                             quantization);
          bVar7 = NearLosslessComponent((char)uVar14 - cVar6,(uint8_t)uVar4,bVar7,quantization);
          uVar14 = (uint)bVar7 | (uint)bVar11 << 8 | (uint)bVar5 << 0x10 | local_8c << 0x18;
        }
        current_row[lVar8] =
             (uVar14 & 0xff00ff) + (uVar4 & 0xff00ff) & 0xff00ff |
             (uVar14 & 0xff00ff00) + (uVar4 & 0xff00ff00) & 0xff00ff00;
      }
      if (current_row[lVar8] < 0x1000000) {
        uVar14 = uVar14 & 0xff000000;
        current_row[lVar8] = uVar4 & 0xffffff;
        if (lVar8 == 0 && y != 0) {
          upper_row[width] = *current_row;
        }
      }
      out[lVar8 - x_start] = uVar14;
      lVar8 = lVar8 + 1;
    } while ((int)lVar8 != x_end);
  }
  return;
}

Assistant:

static WEBP_INLINE void GetResidual(
    int width, int height, uint32_t* const upper_row,
    uint32_t* const current_row, const uint8_t* const max_diffs, int mode,
    int x_start, int x_end, int y, int max_quantization, int exact,
    int used_subtract_green, uint32_t* const out) {
  if (exact) {
    PredictBatch(mode, x_start, y, x_end - x_start, current_row, upper_row,
                 out);
  } else {
    const VP8LPredictorFunc pred_func = VP8LPredictors[mode];
    int x;
    for (x = x_start; x < x_end; ++x) {
      uint32_t predict;
      uint32_t residual;
      if (y == 0) {
        predict = (x == 0) ? ARGB_BLACK : current_row[x - 1];  // Left.
      } else if (x == 0) {
        predict = upper_row[x];  // Top.
      } else {
        predict = pred_func(&current_row[x - 1], upper_row + x);
      }
#if (WEBP_NEAR_LOSSLESS == 1)
      if (max_quantization == 1 || mode == 0 || y == 0 || y == height - 1 ||
          x == 0 || x == width - 1) {
        residual = VP8LSubPixels(current_row[x], predict);
      } else {
        residual = NearLossless(current_row[x], predict, max_quantization,
                                max_diffs[x], used_subtract_green);
        // Update the source image.
        current_row[x] = VP8LAddPixels(predict, residual);
        // x is never 0 here so we do not need to update upper_row like below.
      }
#else
      (void)max_diffs;
      (void)height;
      (void)max_quantization;
      (void)used_subtract_green;
      residual = VP8LSubPixels(current_row[x], predict);
#endif
      if ((current_row[x] & kMaskAlpha) == 0) {
        // If alpha is 0, cleanup RGB. We can choose the RGB values of the
        // residual for best compression. The prediction of alpha itself can be
        // non-zero and must be kept though. We choose RGB of the residual to be
        // 0.
        residual &= kMaskAlpha;
        // Update the source image.
        current_row[x] = predict & ~kMaskAlpha;
        // The prediction for the rightmost pixel in a row uses the leftmost
        // pixel
        // in that row as its top-right context pixel. Hence if we change the
        // leftmost pixel of current_row, the corresponding change must be
        // applied
        // to upper_row as well where top-right context is being read from.
        if (x == 0 && y != 0) upper_row[width] = current_row[0];
      }
      out[x - x_start] = residual;
    }
  }
}